

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reporter.cc
# Opt level: O0

string * benchmark::anon_unknown_2::FormatKV
                   (string *__return_storage_ptr__,string *key,int64_t value)

{
  ostream *poVar1;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  int64_t local_20;
  int64_t value_local;
  string *key_local;
  
  local_20 = value;
  value_local = (int64_t)key;
  key_local = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,'\"');
  poVar1 = std::operator<<(poVar1,(string *)value_local);
  poVar1 = std::operator<<(poVar1,"\": ");
  std::ostream::operator<<(poVar1,local_20);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatKV(std::string const& key, int64_t value) {
  std::stringstream ss;
  ss << '"' << key << "\": " << value;
  return ss.str();
}